

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O0

int get_byte(gz_stream *s)

{
  byte *pbVar1;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  gz_stream *s_local;
  
  if (s->z_eof == 0) {
    if ((s->stream).avail_in == 0) {
      piVar3 = __errno_location();
      *piVar3 = 0;
      sVar4 = fread(s->inbuf,1,0x4000,(FILE *)s->file);
      (s->stream).avail_in = (uInt)sVar4;
      if ((s->stream).avail_in == 0) {
        s->z_eof = 1;
        iVar2 = ferror((FILE *)s->file);
        if (iVar2 != 0) {
          s->z_err = -1;
        }
        return -1;
      }
      (s->stream).next_in = s->inbuf;
    }
    (s->stream).avail_in = (s->stream).avail_in - 1;
    pbVar1 = (s->stream).next_in;
    (s->stream).next_in = pbVar1 + 1;
    s_local._4_4_ = (uint)*pbVar1;
  }
  else {
    s_local._4_4_ = 0xffffffff;
  }
  return s_local._4_4_;
}

Assistant:

local int get_byte(s)
    gz_stream *s;
{
    if (s->z_eof) return EOF;
    if (s->stream.avail_in == 0) {
        errno = 0;
        s->stream.avail_in = (uInt)fread(s->inbuf, 1, Z_BUFSIZE, s->file);
        if (s->stream.avail_in == 0) {
            s->z_eof = 1;
            if (ferror(s->file)) s->z_err = Z_ERRNO;
            return EOF;
        }
        s->stream.next_in = s->inbuf;
    }
    s->stream.avail_in--;
    return *(s->stream.next_in)++;
}